

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

MeasurementSystem __thiscall QLocalePrivate::measurementSystem(QLocalePrivate *this)

{
  long *in_RDI;
  long in_FS_OFFSET;
  TerritoryLanguage *system;
  TerritoryLanguage *__end1;
  TerritoryLanguage *__begin1;
  TerritoryLanguage (*__range1) [5];
  TerritoryLanguage ImperialMeasurementSystems [5];
  short *local_58;
  MeasurementSystem local_3c;
  short local_38 [20];
  short asStack_10 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_38,&DAT_009481a0,0x28);
  local_58 = local_38;
  do {
    if (local_58 == asStack_10) {
      local_3c = MetricSystem;
LAB_004d32f9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_3c;
      }
      __stack_chk_fail();
    }
    if ((*local_58 == *(short *)*in_RDI) && (local_58[1] == *(short *)(*in_RDI + 4))) {
      local_3c = *(MeasurementSystem *)(local_58 + 2);
      goto LAB_004d32f9;
    }
    local_58 = local_58 + 4;
  } while( true );
}

Assistant:

QLocale::MeasurementSystem QLocalePrivate::measurementSystem() const
{
    /* Unicode CLDR's information about measurement systems doesn't say which to
       use by default in each locale. Even if it did, adding another entry in
       every locale's row of locale_data[] would take up much more memory than
       the small table below.
    */
    struct TerritoryLanguage
    {
        quint16 languageId;
        quint16 territoryId;
        QLocale::MeasurementSystem system;
    };
    // TODO: research how realistic and/or complete this is:
    constexpr TerritoryLanguage ImperialMeasurementSystems[] = {
        { QLocale::English, QLocale::UnitedStates, QLocale::ImperialUSSystem },
        { QLocale::English, QLocale::UnitedStatesMinorOutlyingIslands, QLocale::ImperialUSSystem },
        { QLocale::Spanish, QLocale::UnitedStates, QLocale::ImperialUSSystem },
        { QLocale::Hawaiian, QLocale::UnitedStates, QLocale::ImperialUSSystem },
        { QLocale::English, QLocale::UnitedKingdom, QLocale::ImperialUKSystem }
    };

    for (const auto &system : ImperialMeasurementSystems) {
        if (system.languageId == m_data->m_language_id
            && system.territoryId == m_data->m_territory_id) {
            return system.system;
        }
    }
    return QLocale::MetricSystem;
}